

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_ceiling(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
                 lyxp_set *set,int options)

{
  longdouble lVar1;
  int iVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble number;
  
  iVar2 = lyxp_set_cast(*args,LYXP_SET_NUMBER,cur_node,param_4,options);
  if (iVar2 == 0) {
    lVar1 = ((*args)->val).num;
    lVar3 = (longdouble)(long)ROUND(lVar1);
    lVar4 = (longdouble)((long)ROUND(lVar1) + 1);
    number = lVar1;
    if (lVar3 != lVar1) {
      number = lVar4;
    }
    if (NAN(lVar3) || NAN(lVar1)) {
      number = lVar4;
    }
    set_fill_number(set,number);
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
xpath_ceiling(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
              struct lyxp_set *set, int options)
{
    if (lyxp_set_cast(args[0], LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }
    if ((long long)args[0]->val.num != args[0]->val.num) {
        set_fill_number(set, ((long long)args[0]->val.num) + 1);
    } else {
        set_fill_number(set, args[0]->val.num);
    }

    return EXIT_SUCCESS;
}